

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeNext(BtCursor *pCur)

{
  MemPage *pMVar1;
  ushort uVar2;
  int iVar3;
  u32 newPgno;
  int local_2c;
  MemPage *pPage;
  int idx;
  int rc;
  BtCursor *pCur_local;
  
  if (pCur->eState != '\0') {
    if (pCur->eState < 3) {
      local_2c = 0;
    }
    else {
      local_2c = btreeRestoreCursorPosition(pCur);
    }
    if (local_2c != 0) {
      return local_2c;
    }
    if (pCur->eState == '\x01') {
      return 0x65;
    }
    if ((pCur->eState == '\x02') && (pCur->eState = '\0', 0 < pCur->skipNext)) {
      return 0;
    }
  }
  pMVar1 = pCur->pPage;
  uVar2 = pCur->ix + 1;
  pCur->ix = uVar2;
  if ((pMVar1->isInit == '\0') || (iVar3 = sqlite3FaultSim(0x19c), iVar3 != 0)) {
    pCur_local._4_4_ = sqlite3CorruptError(0x121ae);
  }
  else if (uVar2 < pMVar1->nCell) {
    if (pMVar1->leaf == '\0') {
      pCur_local._4_4_ = moveToLeftmost(pCur);
    }
    else {
      pCur_local._4_4_ = 0;
    }
  }
  else if (pMVar1->leaf == '\0') {
    newPgno = sqlite3Get4byte(pMVar1->aData + (int)(pMVar1->hdrOffset + 8));
    pCur_local._4_4_ = moveToChild(pCur,newPgno);
    if (pCur_local._4_4_ == 0) {
      pCur_local._4_4_ = moveToLeftmost(pCur);
    }
  }
  else {
    do {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    } while (pCur->pPage->nCell <= pCur->ix);
    if (pCur->pPage->intKey == '\0') {
      pCur_local._4_4_ = 0;
    }
    else {
      pCur_local._4_4_ = sqlite3BtreeNext(pCur,0);
    }
  }
  return pCur_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->eState==CURSOR_SKIPNEXT ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  idx = ++pCur->ix;
  if( NEVER(!pPage->isInit) || sqlite3FaultSim(412) ){
    return SQLITE_CORRUPT_BKPT;
  }

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
      pPage = pCur->pPage;
    }while( pCur->ix>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, 0);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}